

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  _Base_ptr p_Var3;
  ostringstream *poVar4;
  _Rb_tree_node_base *p_Var5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Matrix<float,_3,_2>_> *pVVar10;
  pointer pcVar11;
  byte bVar12;
  double dVar13;
  pointer pMVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  undefined8 uVar19;
  IVal *pIVar20;
  undefined8 *puVar21;
  long lVar22;
  Matrix<float,_3,_2> *val;
  IVal *pIVar23;
  _Base_ptr p_Var24;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  *pBVar25;
  FloatFormat *pFVar26;
  byte bVar27;
  long lVar28;
  TestStatus *pTVar29;
  IVal in2;
  IVal in3;
  IVal in1;
  IVal in0;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  outputs;
  void *outputArr [2];
  FuncSet funcs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  float in_stack_fffffffffffff9c8;
  _Alloc_hider _Var30;
  undefined8 uStack_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  TestLog *local_618;
  size_t local_610;
  string local_608;
  ulong local_5e8;
  FloatFormat *local_5e0;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  *local_5d8;
  long local_5d0;
  TestStatus *local_5c8;
  long local_5c0;
  undefined1 local_5b8 [144];
  undefined1 local_528 [12];
  YesNoMaybe YStack_51c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  double local_508;
  Precision local_500;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_4f8;
  undefined4 local_4f0;
  double adStack_4e0 [5];
  ios_base local_4b8 [8];
  ios_base local_4b0 [264];
  FloatFormat local_3a8;
  long local_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_378;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  local_348;
  pointer local_318;
  pointer local_310;
  undefined1 local_308 [12];
  YesNoMaybe YStack_2fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Rb_tree_node_base *local_2e8;
  double local_2e0;
  IVal local_2c0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  this_00 = this->m_samplings;
  pFVar26 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_5c8 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_5e0 = pFVar26;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,3,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar26,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar17 + 0xdeadbeef),
             (deUint32)in_stack_fffffffffffff9c8);
  pMVar14 = local_278.in0.
            super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_610 = ((long)local_278.in0.
                     super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.in0.
                     super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>::
  Outputs(&local_348,local_610);
  local_3a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_3a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_3a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_3a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_3a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_3a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_3a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_3a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_3a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_378._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_378._M_impl.super__Rb_tree_header._M_header;
  local_378._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_378._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_378._M_impl.super__Rb_tree_header._M_header._M_right =
       local_378._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_618 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_318 = local_348.out0.
              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_310 = local_348.out1.
              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_528 + 8);
  local_528._0_8_ = local_618;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_5d8 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_4b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var5 = (_Rb_tree_node_base *)(local_308 + 8);
  local_308._8_4_ = _S_red;
  local_2f8._M_allocated_capacity = 0;
  local_2e0 = 0.0;
  pSVar8 = (local_5d8->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_2f8._8_8_ = p_Var5;
  local_2e8 = p_Var5;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_308);
  if ((_Rb_tree_node_base *)local_2f8._8_8_ != p_Var5) {
    uVar19 = local_2f8._8_8_;
    do {
      (**(code **)(**(long **)(uVar19 + 0x20) + 0x30))(*(long **)(uVar19 + 0x20),local_1a8);
      uVar19 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar19);
    } while ((_Rb_tree_node_base *)uVar19 != p_Var5);
  }
  pBVar25 = local_5d8;
  if (local_2e0 != 0.0) {
    poVar4 = (ostringstream *)(local_528 + 8);
    local_528._0_8_ = local_618;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)local_5b8._0_8_,local_5b8._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_5b8._0_8_ != (IVal *)(local_5b8 + 0x10)) {
      operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_4b0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_308);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar9 = (pBVar25->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_610,&local_218,&local_318,0);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_528);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_308);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_378,
             (pBVar25->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr,
             (IVal *)local_528);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_378,
             (pBVar25->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_5b8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_378,
             (pBVar25->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffff9c8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_378,
             (pBVar25->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_608);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_378,
             (pBVar25->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_378,
             (pBVar25->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr,
             (IVal *)local_308);
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar14) {
LAB_008e042b:
    poVar4 = (ostringstream *)(local_528 + 8);
    local_528._0_8_ = local_618;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar29 = local_5c8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_4b0);
    local_528._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_528 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"Pass","");
    pTVar29->m_code = QP_TEST_RESULT_PASS;
    (pTVar29->m_description)._M_dataplus._M_p = (pointer)&(pTVar29->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar29->m_description,local_528._0_8_,
               (char *)(local_528._0_8_ + CONCAT44(YStack_51c,local_528._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_528 + 0x10)) goto LAB_008e0610;
    uVar19 = (_Base_ptr)
             CONCAT44(local_518._M_allocated_capacity._4_4_,local_518._M_allocated_capacity._0_4_);
    local_308._0_8_ = local_528._0_8_;
  }
  else {
    local_380 = local_610 + (local_610 == 0);
    lVar28 = 0;
    local_5c0 = 0xc;
    local_5e8 = 0;
    pFVar26 = local_5e0;
    do {
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_308);
      _Var30._M_p = (pointer)0x0;
      uStack_630 = 0;
      local_628._M_allocated_capacity = 0;
      lVar22 = 0;
      do {
        *(undefined4 *)(&stack0xfffffffffffff9c8 + lVar22 * 4) =
             *(undefined4 *)
              ((long)(((local_278.in0.
                        super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data + -1) +
              lVar22 * 4 + local_5c0);
        *(undefined4 *)((long)&uStack_630 + lVar22 * 4 + 4) =
             *(undefined4 *)
              ((long)((local_278.in0.
                       super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
              lVar22 * 4 + local_5c0);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 3);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doRound
                ((IVal *)local_5b8,pFVar26,(Matrix<float,_3,_2> *)&stack0xfffffffffffff9c8);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_528,pFVar26,(IVal *)local_5b8);
      pIVar20 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_378,
                           (pBVar25->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      lVar22 = 0;
      do {
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[0].m_hi + lVar22) =
             *(undefined8 *)(local_528 + lVar22 + 0x10);
        dVar13 = *(double *)(local_528 + lVar22 + 8);
        pbVar2 = &(pIVar20->m_data).m_data[0].m_data[0].m_hasNaN + lVar22;
        *(undefined8 *)pbVar2 = *(undefined8 *)(local_528 + lVar22);
        *(double *)(pbVar2 + 8) = dVar13;
        dVar13 = *(double *)((long)adStack_4e0 + lVar22 + 8);
        pbVar2 = &(pIVar20->m_data).m_data[1].m_data[0].m_hasNaN + lVar22;
        *(undefined8 *)pbVar2 = *(undefined8 *)((long)adStack_4e0 + lVar22);
        *(double *)(pbVar2 + 8) = dVar13;
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[1].m_data[0].m_hi + lVar22) =
             *(undefined8 *)((long)adStack_4e0 + lVar22 + 0x10);
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x48);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_378,
                 (pBVar25->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_378,
                 (pBVar25->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_378,
                 (pBVar25->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_500 = (pBVar25->m_caseCtx).precision;
      local_508 = pFVar26->m_maxValue;
      local_528._0_8_ = *(undefined8 *)pFVar26;
      local_528._8_4_ = pFVar26->m_fractionBits;
      YStack_51c = pFVar26->m_hasSubnormal;
      local_518._M_allocated_capacity._0_4_ = pFVar26->m_hasInf;
      local_518._M_allocated_capacity._4_4_ = pFVar26->m_hasNaN;
      local_518._8_1_ = pFVar26->m_exactPrecision;
      local_518._9_3_ = *(undefined3 *)&pFVar26->field_0x19;
      local_518._12_4_ = *(undefined4 *)&pFVar26->field_0x1c;
      local_4f0 = 0;
      pSVar8 = (pBVar25->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_4f8 = &local_378;
      (*pSVar8->_vptr_Statement[3])(pSVar8,local_528);
      pIVar20 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_378,
                           (pBVar25->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_528,&local_3a8,pIVar20);
      pMVar14 = local_348.out1.
                super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = 0;
      do {
        *(undefined8 *)((long)&local_2f8 + lVar22) = *(undefined8 *)(local_528 + lVar22 + 0x10);
        uVar19 = *(undefined8 *)(local_528 + lVar22 + 8);
        *(undefined8 *)(local_308 + lVar22) = *(undefined8 *)(local_528 + lVar22);
        *(undefined8 *)(local_308 + lVar22 + 8) = uVar19;
        uVar19 = *(undefined8 *)((long)adStack_4e0 + lVar22 + 8);
        *(undefined8 *)(&local_2c0.m_data[0].m_hasNaN + lVar22) =
             *(undefined8 *)((long)adStack_4e0 + lVar22);
        *(undefined8 *)((long)&local_2c0.m_data[0].m_lo + lVar22) = uVar19;
        *(undefined8 *)((long)&local_2c0.m_data[0].m_hi + lVar22) =
             *(undefined8 *)((long)adStack_4e0 + lVar22 + 0x10);
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x48);
      bVar27 = 1;
      pIVar23 = (IVal *)local_308;
      lVar22 = 0;
      local_5d0 = lVar28;
      do {
        bVar15 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                           (pIVar23,pMVar14[lVar28].m_data.m_data + lVar22);
        lVar22 = 1;
        pIVar23 = &local_2c0;
        bVar12 = bVar27 & bVar15;
        bVar27 = 0;
      } while (bVar12 != 0);
      local_528._0_8_ = local_528 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_528,"Shader output 1 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(&local_1f8,bVar15,(string *)local_528);
      if ((TestLog *)local_528._0_8_ != (TestLog *)(local_528 + 0x10)) {
        operator_delete((void *)local_528._0_8_,
                        CONCAT44(local_518._M_allocated_capacity._4_4_,
                                 local_518._M_allocated_capacity._0_4_) + 1);
      }
      pIVar20 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_378,
                           (pBVar25->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_528,&local_3a8,pIVar20);
      pMVar14 = local_348.out0.
                super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = 0;
      do {
        *(undefined8 *)(local_1a8 + lVar22 + 0x10) = *(undefined8 *)(local_528 + lVar22 + 0x10);
        uVar19 = *(undefined8 *)(local_528 + lVar22 + 8);
        *(undefined8 *)(local_1a8 + lVar22) = *(undefined8 *)(local_528 + lVar22);
        *(undefined8 *)(local_1a8 + lVar22 + 8) = uVar19;
        uVar19 = *(undefined8 *)((long)adStack_4e0 + lVar22 + 8);
        *(undefined8 *)(local_1a8 + lVar22 + 0x48) = *(undefined8 *)((long)adStack_4e0 + lVar22);
        *(undefined8 *)(local_1a8 + lVar22 + 0x50) = uVar19;
        *(undefined8 *)(local_1a8 + lVar22 + 0x58) =
             *(undefined8 *)((long)adStack_4e0 + lVar22 + 0x10);
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x48);
      bVar27 = 1;
      lVar22 = 0;
      pIVar23 = (IVal *)local_1a8;
      do {
        bVar16 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                           (pIVar23,pMVar14[lVar28].m_data.m_data + lVar22);
        lVar22 = 1;
        bVar12 = bVar27 & bVar16;
        bVar27 = 0;
        pIVar23 = (IVal *)(local_1a8 + 0x48);
      } while (bVar12 != 0);
      local_528._0_8_ = local_528 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_528,"Shader output 0 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(&local_1f8,bVar16,(string *)local_528);
      lVar22 = local_5d0;
      pBVar25 = local_5d8;
      if ((TestLog *)local_528._0_8_ != (TestLog *)(local_528 + 0x10)) {
        operator_delete((void *)local_528._0_8_,
                        CONCAT44(local_518._M_allocated_capacity._4_4_,
                                 local_518._M_allocated_capacity._0_4_) + 1);
      }
      pFVar26 = local_5e0;
      if (!bVar15 || !bVar16) {
        uVar18 = (int)local_5e8 + 1;
        local_5e8 = (ulong)uVar18;
        poVar4 = (ostringstream *)(local_528 + 8);
        lVar22 = local_5d0;
        if ((int)uVar18 < 0x65) {
          local_528._0_8_ = local_618;
          std::__cxx11::ostringstream::ostringstream(poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
          pVVar10 = (pBVar25->m_variables).in0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                    .m_ptr;
          val = (Matrix<float,_3,_2> *)(local_5b8 + 0x10);
          pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
          local_5b8._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b8,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_5b8._0_8_,local_5b8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
          valueToString<tcu::Matrix<float,3,2>>
                    ((string *)&stack0xfffffffffffff9c8,(shaderexecutor *)&local_3a8,
                     (FloatFormat *)
                     (local_278.in0.
                      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar28),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,_Var30._M_p,uStack_630);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var30._M_p != &local_628) {
            operator_delete(_Var30._M_p,local_628._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_3,_2> *)local_5b8._0_8_ != (Matrix<float,_3,_2> *)(local_5b8 + 0x10)) {
            operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
          pVVar10 = (pBVar25->m_variables).out0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                    .m_ptr;
          pIVar20 = (IVal *)(local_5b8 + 0x10);
          pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
          local_5b8._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b8,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_5b8._0_8_,local_5b8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
          valueToString<tcu::Matrix<float,3,2>>
                    ((string *)&stack0xfffffffffffff9c8,(shaderexecutor *)&local_3a8,
                     (FloatFormat *)
                     (local_348.out0.
                      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar28),
                     (Matrix<float,_3,_2> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,_Var30._M_p,uStack_630);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,3,2>>
                    (&local_608,(shaderexecutor *)&local_3a8,(FloatFormat *)local_1a8,pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,local_608._M_dataplus._M_p,local_608._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p != &local_608.field_2) {
            operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var30._M_p != &local_628) {
            operator_delete(_Var30._M_p,local_628._M_allocated_capacity + 1);
          }
          if ((IVal *)local_5b8._0_8_ != (IVal *)(local_5b8 + 0x10)) {
            operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
          pVVar10 = (pBVar25->m_variables).out1.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                    .m_ptr;
          pIVar20 = (IVal *)(local_5b8 + 0x10);
          pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
          local_5b8._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b8,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_5b8._0_8_,local_5b8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
          valueToString<tcu::Matrix<float,3,2>>
                    ((string *)&stack0xfffffffffffff9c8,(shaderexecutor *)&local_3a8,
                     (FloatFormat *)
                     (local_348.out1.
                      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar28),
                     (Matrix<float,_3,_2> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,_Var30._M_p,uStack_630);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,3,2>>
                    (&local_608,(shaderexecutor *)&local_3a8,(FloatFormat *)local_308,pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,local_608._M_dataplus._M_p,local_608._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p != &local_608.field_2) {
            operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var30._M_p != &local_628) {
            operator_delete(_Var30._M_p,local_628._M_allocated_capacity + 1);
          }
          if ((IVal *)local_5b8._0_8_ != (IVal *)(local_5b8 + 0x10)) {
            operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar4);
          std::ios_base::~ios_base(local_4b0);
          lVar22 = local_5d0;
        }
      }
      lVar28 = lVar22 + 1;
      local_5c0 = local_5c0 + 0x18;
    } while (lVar28 != local_380);
    iVar17 = (int)local_5e8;
    if (iVar17 < 0x65) {
      if (iVar17 == 0) goto LAB_008e042b;
    }
    else {
      poVar4 = (ostringstream *)(local_528 + 8);
      local_528._0_8_ = local_618;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      std::ostream::operator<<(poVar4,iVar17 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_4b0);
    }
    poVar4 = (ostringstream *)(local_528 + 8);
    local_528._0_8_ = local_618;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_4b0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    std::ostream::operator<<(local_528,iVar17);
    pTVar29 = local_5c8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
    std::ios_base::~ios_base(local_4b8);
    local_528._0_8_ = local_528 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_528," test failed. Check log for the details","");
    p_Var3 = (_Base_ptr)
             (CONCAT44(YStack_51c,local_528._8_4_) + CONCAT44(YStack_2fc,local_308._8_4_));
    uVar19 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      uVar19 = local_2f8._M_allocated_capacity;
    }
    if ((ulong)uVar19 < p_Var3) {
      p_Var24 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_528 + 0x10)) {
        p_Var24 = (_Base_ptr)
                  CONCAT44(local_518._M_allocated_capacity._4_4_,
                           local_518._M_allocated_capacity._0_4_);
      }
      if (p_Var24 < p_Var3) goto LAB_008e0419;
      puVar21 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_528,0,(char *)0x0,local_308._0_8_);
    }
    else {
LAB_008e0419:
      puVar21 = (undefined8 *)std::__cxx11::string::_M_append(local_308,local_528._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar21 + 2);
    if ((double *)*puVar21 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar21 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar21 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar21;
    }
    local_1a8._8_8_ = puVar21[1];
    *puVar21 = pdVar1;
    puVar21[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar29->m_code = QP_TEST_RESULT_FAIL;
    (pTVar29->m_description)._M_dataplus._M_p = (pointer)&(pTVar29->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar29->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_528 + 0x10)) {
      operator_delete((void *)local_528._0_8_,
                      CONCAT44(local_518._M_allocated_capacity._4_4_,
                               local_518._M_allocated_capacity._0_4_) + 1);
    }
    uVar19 = local_2f8._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ == &local_2f8) goto LAB_008e0610;
  }
  operator_delete((void *)local_308._0_8_,(ulong)((long)&((_Base_ptr)uVar19)->_M_color + 1));
LAB_008e0610:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_378);
  if (local_348.out1.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.out1.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_348.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348.out0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_348.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar29;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}